

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::InstanceCacheKey,slang::ast::InstanceBodySymbol_const&>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,
          InstanceCacheKey *args_1,InstanceBodySymbol *args_2)

{
  group_type_pointer pgVar1;
  undefined8 *puVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  uint uVar5;
  ushort uVar6;
  pointer ppVar7;
  ulong uVar8;
  long lVar9;
  group_type_pointer pgVar10;
  ulong uVar11;
  pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>
  *ppVar12;
  undefined1 auVar13 [16];
  
  pgVar10 = __return_storage_ptr__->pg;
  uVar8 = (ulong)__return_storage_ptr__->n;
  ppVar12 = __return_storage_ptr__->p;
  lVar9 = 1;
  while( true ) {
    pgVar1 = arrays_->groups_ + pos0;
    pgVar3 = arrays_->groups_ + pos0;
    auVar13[0] = -(pgVar3->m[0].n == '\0');
    auVar13[1] = -(pgVar3->m[1].n == '\0');
    auVar13[2] = -(pgVar3->m[2].n == '\0');
    auVar13[3] = -(pgVar3->m[3].n == '\0');
    auVar13[4] = -(pgVar3->m[4].n == '\0');
    auVar13[5] = -(pgVar3->m[5].n == '\0');
    auVar13[6] = -(pgVar3->m[6].n == '\0');
    auVar13[7] = -(pgVar3->m[7].n == '\0');
    auVar13[8] = -(pgVar3->m[8].n == '\0');
    auVar13[9] = -(pgVar3->m[9].n == '\0');
    auVar13[10] = -(pgVar3->m[10].n == '\0');
    auVar13[0xb] = -(pgVar3->m[0xb].n == '\0');
    auVar13[0xc] = -(pgVar3->m[0xc].n == '\0');
    auVar13[0xd] = -(pgVar3->m[0xd].n == '\0');
    auVar13[0xe] = -(pgVar3->m[0xe].n == '\0');
    auVar13[0xf] = -(pgVar3->m[0xf].n == '\0');
    uVar6 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe;
    if (uVar6 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar5 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar8 = (ulong)uVar5;
      ppVar4 = arrays_->elements_;
      uVar11 = (ulong)(uVar5 << 6);
      ppVar12 = (pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>
                 *)((long)&ppVar4[pos0 * 0xf].first.symbol.ptr + uVar11);
      *(InstanceSymbol **)((long)&ppVar4[pos0 * 0xf].first.symbol.ptr + uVar11) =
           (args_1->symbol).ptr;
      ppVar7 = (args_1->ifaceKeys).
               super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar2 = (undefined8 *)
               ((long)&ppVar4[pos0 * 0xf].first.ifaceKeys.
                       super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar11);
      *puVar2 = (args_1->ifaceKeys).
                super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2[1] = ppVar7;
      *(pointer *)
       ((long)&ppVar4[pos0 * 0xf].first.ifaceKeys.
               super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + uVar11) =
           (args_1->ifaceKeys).
           super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (args_1->ifaceKeys).
      super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (args_1->ifaceKeys).
      super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (args_1->ifaceKeys).
      super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(size_t *)((long)&ppVar4[pos0 * 0xf].first.savedHash + uVar11) = args_1->savedHash;
      *(InstanceBodySymbol **)((long)&ppVar4[pos0 * 0xf].second.canonicalBody.ptr + uVar11) = args_2
      ;
      (&ppVar4[pos0 * 0xf].second.sideEffects.
        super__Optional_base<const_slang::ast::Compilation::InstanceSideEffects_*,_true,_true>.
        _M_payload.
        super__Optional_payload_base<const_slang::ast::Compilation::InstanceSideEffects_*>.
        _M_engaged)[uVar11] = false;
      pgVar1->m[uVar8].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar10 = pgVar1;
    }
    if (uVar6 != 0) break;
    pos0 = pos0 + lVar9 & arrays_->groups_size_mask;
    lVar9 = lVar9 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar8;
  __return_storage_ptr__->p = ppVar12;
  __return_storage_ptr__->pg = pgVar10;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }